

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O0

void test_cpp_wrapper_equality_duplicates(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key)

{
  long lVar1;
  int *expected_values;
  Dictionary<int,_int> *pDVar2;
  Dictionary<int,_int> *pDVar3;
  int iVar4;
  int iVar5;
  undefined8 uStack_50;
  int aiStack_48 [2];
  int *local_40;
  int local_34;
  ulong uStack_30;
  int i;
  unsigned_long __vla_expr0;
  int local_1c;
  Dictionary<int,_int> *pDStack_18;
  int key_local;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  __vla_expr0 = (unsigned_long)aiStack_48;
  uStack_30 = (ulong)(uint)key;
  lVar1 = -(uStack_30 * 4 + 0xf & 0xfffffffffffffff0);
  local_40 = (int *)((long)aiStack_48 + lVar1);
  local_1c = key;
  pDStack_18 = dict;
  dict_local = (Dictionary<int,_int> *)tc;
  for (local_34 = 1; pDVar3 = dict_local, pDVar2 = pDStack_18, iVar5 = local_1c,
      expected_values = local_40, local_34 <= local_1c; local_34 = local_34 + 1) {
    iVar4 = local_34 << 1;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x110421;
    cpp_wrapper_insert((planck_unit_test_t *)pDVar3,pDVar2,iVar5,iVar4,'\0');
    pDVar3 = dict_local;
    pDVar2 = pDStack_18;
    local_40[local_34 + -1] = local_34 << 1;
    iVar4 = local_34 + -1;
    iVar5 = local_34 + -1;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x110454;
    cpp_wrapper_insert((planck_unit_test_t *)pDVar3,pDVar2,iVar4,iVar5 * 2,'\0');
  }
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x11047d;
  cpp_wrapper_equality((planck_unit_test_t *)pDVar3,pDVar2,iVar5,expected_values,iVar5,'\x01');
  return;
}

Assistant:

void
test_cpp_wrapper_equality_duplicates(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key
) {
	int values[key];

	for (int i = 1; i <= key; i++) {
		cpp_wrapper_insert(tc, dict, key, i * 2, boolean_false);
		values[i - 1] = i * 2;

		cpp_wrapper_insert(tc, dict, i - 1, (i - 1) * 2, boolean_false);
	}

	cpp_wrapper_equality(tc, dict, key, values, key, boolean_true);
}